

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

void __thiscall
Fad<double>::
Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,FadExpr<FadFuncTanh<Fad<double>>>>>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncCos<Fad<double>>>>>>>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncSin<Fad<double>>>>>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadCst<int>>>,FadCst<int>>>>>
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_> *pFVar2;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_> *pFVar3;
  Fad<double> *pFVar4;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
  *pFVar5;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
  *pFVar6;
  FadExpr<FadFuncTanh<Fad<double>_>_> *pFVar7;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar8;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar9;
  uint uVar10;
  uint uVar11;
  double *pdVar12;
  ulong uVar13;
  value_type vVar14;
  value_type vVar15;
  
  vVar14 = FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>
           ::val(&((fadexpr->fadexpr_).left_)->fadexpr_);
  pFVar2 = (fadexpr->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  this->val_ = vVar14 / ((double)(pFVar2->fadexpr_).right_.constant_ *
                        (double)(pFVar3->fadexpr_).right_.constant_ * pFVar4->val_);
  pFVar5 = (fadexpr->fadexpr_).left_;
  pFVar6 = (pFVar5->fadexpr_).right_;
  pFVar7 = (((pFVar5->fadexpr_).left_)->fadexpr_).right_;
  pFVar8 = (((((pFVar6->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).right_;
  uVar1 = (pFVar8->fadexpr_).expr_.dx_.num_elts;
  pFVar9 = (((pFVar6->fadexpr_).right_)->fadexpr_).right_;
  uVar10 = (pFVar9->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar10 < (int)uVar1) {
    uVar10 = uVar1;
  }
  uVar1 = (pFVar7->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar10 < (int)uVar1) {
    uVar10 = uVar1;
  }
  uVar1 = (pFVar4->dx_).num_elts;
  if ((int)uVar10 <= (int)uVar1) {
    uVar10 = uVar1;
  }
  (this->dx_).num_elts = 0;
  (this->dx_).ptr_to_data = (double *)0x0;
  if (0 < (int)uVar10) {
    (this->dx_).num_elts = uVar10;
    pdVar12 = (double *)operator_new__((ulong)uVar10 << 3);
    (this->dx_).ptr_to_data = pdVar12;
  }
  this->defaultVal = 0.0;
  uVar1 = (pFVar7->fadexpr_).expr_.dx_.num_elts;
  uVar10 = (pFVar8->fadexpr_).expr_.dx_.num_elts;
  uVar11 = (pFVar9->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar11 < (int)uVar10) {
    uVar11 = uVar10;
  }
  if ((int)uVar11 < (int)uVar1) {
    uVar11 = uVar1;
  }
  uVar1 = (pFVar4->dx_).num_elts;
  if ((int)uVar11 <= (int)uVar1) {
    uVar11 = uVar1;
  }
  if (0 < (int)uVar11) {
    uVar13 = 0;
    do {
      vVar15 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>_>
               ::dx(&fadexpr->fadexpr_,(int)uVar13);
      (this->dx_).ptr_to_data[uVar13] = vVar15;
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }